

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution>
::verifyImageData(TestStatus *__return_storage_ptr__,
                 MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *this,
                 VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
                 vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  ulong uVar1;
  float fVar2;
  undefined8 uVar3;
  VkSampleCountFlagBits VVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *pvVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  ulong __n;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  float in_XMM1_Db;
  float in_XMM1_Dd;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  IVec4 IVar37;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  ConstPixelBufferAccess local_108;
  TestStatus *local_e0;
  string *local_d8;
  VkImageCreateInfo *local_d0;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_c8;
  ulong local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ChannelType local_3c;
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  
  VVar4 = imageMSInfo->samples;
  __n = (ulong)VVar4;
  local_68 = (float)__n;
  fStack_60 = 0.0;
  fVar20 = SQRT(1.0 / (local_68 * 12.0));
  auVar22._0_4_ = fVar20 + fVar20;
  _local_78 = ZEXT416((uint)auVar22._0_4_);
  uVar9 = (imageRSInfo->extent).depth;
  local_e0 = __return_storage_ptr__;
  local_d0 = imageMSInfo;
  fStack_64 = in_XMM1_Db;
  fStack_5c = in_XMM1_Dd;
  if (uVar9 != 0) {
    local_d8 = (string *)&__return_storage_ptr__->m_description;
    local_80 = &(__return_storage_ptr__->m_description).field_2;
    uVar16 = (imageRSInfo->extent).height;
    auVar22._4_4_ = auVar22._0_4_;
    auVar22._8_4_ = auVar22._0_4_;
    auVar22._12_4_ = auVar22._0_4_;
    uVar11 = 0;
    uVar10 = uVar16;
    local_c8 = dataPerSample;
    local_98._0_16_ = auVar22;
    do {
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar9 = (imageRSInfo->extent).width;
        uVar10 = 0;
        do {
          bVar17 = uVar9 != 0;
          uVar9 = 0;
          if (bVar17) {
            uVar16 = 0;
            do {
              iVar18 = (int)dataRS;
              tcu::ConstPixelBufferAccess::getPixelInt(&local_108,iVar18,uVar16,uVar10);
              if (local_108.m_size.m_data[0] != 0) {
                local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,"gl_SamplePosition is not within interval [0,1]","")
                ;
                local_e0->m_code = QP_TEST_RESULT_FAIL;
                (local_e0->m_description)._M_dataplus._M_p = (pointer)local_80;
                std::__cxx11::string::_M_construct<char*>
                          (local_d8,local_108.m_format,
                           CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0]) +
                           (long)local_108.m_format);
                goto LAB_004e059c;
              }
              if ((VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT) < VVar4) {
                tcu::ConstPixelBufferAccess::getPixelInt(&local_108,iVar18,uVar16,uVar10);
                local_58 = ZEXT416(local_108.m_format.order);
                IVar37 = tcu::ConstPixelBufferAccess::getPixelInt
                                   ((ConstPixelBufferAccess *)local_b8,iVar18,uVar16,uVar10);
                auVar32._4_4_ = local_58._0_4_;
                auVar32._0_4_ = local_b8._4_4_;
                auVar32._8_4_ = local_58._0_4_;
                auVar32._12_4_ = local_b8._4_4_;
                auVar31._8_8_ = auVar32._8_8_;
                auVar31._4_4_ = 0;
                auVar31._0_4_ = local_b8._4_4_;
                auVar33._0_12_ = auVar31._0_12_;
                auVar33._12_4_ = 0;
                auVar21._0_4_ = (float)(SUB168(auVar33 | _DAT_00ac4a10,0) - (double)DAT_00ac4a10);
                auVar21._4_4_ = (float)(SUB168(auVar33 | _DAT_00ac4a10,8) - DAT_00ac4a10._8_8_);
                auVar21._8_8_ = 0;
                auVar22 = divps(auVar21,_DAT_00ae7490);
                auVar23._0_4_ = auVar22._0_4_ + -0.5;
                auVar23._4_4_ = auVar22._4_4_ + -0.5;
                auVar23._8_4_ = auVar22._8_4_ + 0.0;
                auVar23._12_4_ = auVar22._12_4_ + 0.0;
                uVar15 = CONCAT44(auVar23._4_4_,auVar23._0_4_);
                auVar34._0_8_ = uVar15 ^ 0x8000000080000000;
                auVar34._8_4_ = -auVar23._8_4_;
                auVar34._12_4_ = -auVar23._12_4_;
                auVar22 = maxps(auVar34,auVar23);
                iVar18 = -(uint)((float)local_98._0_4_ < auVar22._0_4_);
                iVar19 = -(uint)((float)local_98._4_4_ < auVar22._4_4_);
                auVar25._4_4_ = iVar19;
                auVar25._0_4_ = iVar18;
                auVar25._8_4_ = iVar19;
                auVar25._12_4_ = iVar19;
                auVar24._8_8_ = auVar25._8_8_;
                auVar24._4_4_ = iVar18;
                auVar24._0_4_ = iVar18;
                iVar18 = movmskpd(IVar37.m_data[0],auVar24);
                if (iVar18 != 0) {
                  local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_108,
                             "Sample positions are not uniformly distributed within the pixel","");
                  local_e0->m_code = QP_TEST_RESULT_FAIL;
                  (local_e0->m_description)._M_dataplus._M_p = (pointer)local_80;
                  std::__cxx11::string::_M_construct<char*>
                            (local_d8,local_108.m_format,
                             CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0]) +
                             (long)local_108.m_format);
                  goto LAB_004e059c;
                }
              }
              uVar16 = uVar16 + 1;
              uVar9 = (imageRSInfo->extent).width;
            } while (uVar16 < uVar9);
            uVar16 = (imageRSInfo->extent).height;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar16);
        uVar9 = (imageRSInfo->extent).depth;
        dataPerSample = local_c8;
        uVar10 = uVar16;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar9);
  }
  uVar9 = (local_d0->extent).depth;
  if (uVar9 != 0) {
    local_98._0_8_ = &local_e0->m_description;
    local_d8 = (string *)&(local_e0->m_description).field_2;
    uVar16 = (local_d0->extent).height;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    local_78._4_4_ = local_78._0_4_;
    uStack_70 = local_78._0_4_;
    uStack_6c = local_78._0_4_;
    uVar11 = 0;
    uVar10 = uVar16;
    local_c8 = dataPerSample;
    local_c0 = __n;
    do {
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar9 = (local_d0->extent).width;
        uVar10 = 0;
        do {
          bVar17 = uVar9 != 0;
          uVar9 = 0;
          if (bVar17) {
            uVar16 = 0;
            do {
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_b8,__n,(allocator_type *)&local_108);
              bVar17 = true;
              if (__n != 0) {
                uVar15 = 0;
                do {
                  iVar18 = (int)uVar15 * 0x28;
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_108,
                             (int)(local_c8->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + iVar18,uVar16,uVar10)
                  ;
                  pvVar7 = local_c8;
                  if (local_108.m_size.m_data[0] != 0) {
                    local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_108,"gl_SamplePosition is not within interval [0,1]"
                               ,"");
                    local_e0->m_code = QP_TEST_RESULT_FAIL;
                    (local_e0->m_description)._M_dataplus._M_p = (pointer)local_d8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_98._0_8_,local_108.m_format,
                               CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0]) +
                               (long)local_108.m_format);
                    __n = local_c0;
                    goto LAB_004e0435;
                  }
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_108,
                             (int)(local_c8->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + iVar18,uVar16,uVar10)
                  ;
                  local_58._12_4_ = local_108.m_size.m_data[1];
                  local_58._8_4_ = local_108.m_size.m_data[0];
                  local_58._0_4_ = local_108.m_format.order;
                  local_58._4_4_ = local_108.m_format.type;
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                             iVar18 + (int)(pvVar7->
                                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                           )._M_impl.super__Vector_impl_data._M_start,uVar16,uVar10)
                  ;
                  __n = local_c0;
                  auVar35._4_4_ = 0;
                  auVar35._0_4_ = local_58._0_4_;
                  auVar35._8_4_ = local_3c;
                  auVar35._12_4_ = 0;
                  auVar26._0_4_ = (float)(SUB168(auVar35 | _DAT_00ac4a10,0) - (double)DAT_00ac4a10);
                  auVar26._4_4_ = (float)(SUB168(auVar35 | _DAT_00ac4a10,8) - DAT_00ac4a10._8_8_);
                  auVar26._8_8_ = 0;
                  auVar22 = divps(auVar26,_DAT_00ae7490);
                  *(long *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + uVar15 * 8) = auVar22._0_8_;
                  uVar15 = uVar15 + 1;
                } while (uVar15 != local_c0);
                if (local_c0 == 0) {
                  bVar17 = true;
                }
                else {
                  lVar8 = 1;
                  bVar17 = true;
                  uVar15 = 0;
                  do {
                    uVar1 = uVar15 + 1;
                    if (uVar1 < local_c0) {
                      lVar12 = lVar8;
                      do {
                        bVar13 = true;
                        lVar14 = 0;
                        while( true ) {
                          fVar20 = *(float *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + uVar15 * 8 +
                                             lVar14 * 4);
                          fVar2 = *(float *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + lVar12 * 8 +
                                            lVar14 * 4);
                          if (!bVar13) break;
                          lVar14 = 1;
                          bVar13 = false;
                          if ((fVar20 != fVar2) || (NAN(fVar20) || NAN(fVar2))) break;
                        }
                        if ((fVar20 == fVar2) && (!NAN(fVar20) && !NAN(fVar2))) {
                          local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_108,"Two samples have the same position","");
                          local_e0->m_code = QP_TEST_RESULT_FAIL;
                          (local_e0->m_description)._M_dataplus._M_p = (pointer)local_d8;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_98._0_8_,local_108.m_format,
                                     CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0])
                                     + (long)local_108.m_format);
                          goto LAB_004e0435;
                        }
                        lVar12 = lVar12 + 1;
                      } while ((uint)local_c0 != (uint)lVar12);
                    }
                    lVar8 = lVar8 + 1;
                    uVar15 = uVar1;
                  } while (uVar1 != local_c0);
                  if (3 < (uint)local_c0) {
                    uVar15 = 0;
                    auVar22 = ZEXT816(0);
                    do {
                      uVar3 = *(undefined8 *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + uVar15 * 8);
                      auVar27._0_4_ = auVar22._0_4_ + (float)uVar3;
                      auVar27._4_4_ = auVar22._4_4_ + (float)((ulong)uVar3 >> 0x20);
                      auVar27._8_4_ = auVar22._8_4_ + 0.0;
                      auVar27._12_4_ = auVar22._12_4_ + 0.0;
                      uVar15 = uVar15 + 1;
                      auVar22 = auVar27;
                    } while (local_c0 != uVar15);
                    auVar6._4_4_ = fStack_64;
                    auVar6._0_4_ = local_68;
                    auVar6._8_4_ = fStack_60;
                    auVar6._12_4_ = fStack_5c;
                    auVar22 = divps(auVar27,auVar6);
                    auVar28._0_4_ = auVar22._0_4_ + -0.5;
                    auVar28._4_4_ = auVar22._4_4_ + -0.5;
                    auVar28._8_4_ = auVar22._8_4_ + 0.0;
                    auVar28._12_4_ = auVar22._12_4_ + 0.0;
                    uVar15 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
                    auVar36._0_8_ = uVar15 ^ 0x8000000080000000;
                    auVar36._8_4_ = -auVar28._8_4_;
                    auVar36._12_4_ = -auVar28._12_4_;
                    auVar22 = maxps(auVar36,auVar28);
                    iVar18 = -(uint)((float)local_78._0_4_ < auVar22._0_4_);
                    iVar19 = -(uint)((float)local_78._4_4_ < auVar22._4_4_);
                    auVar30._4_4_ = iVar19;
                    auVar30._0_4_ = iVar18;
                    auVar30._8_4_ = iVar19;
                    auVar30._12_4_ = iVar19;
                    auVar29._8_8_ = auVar30._8_8_;
                    auVar29._4_4_ = iVar18;
                    auVar29._0_4_ = iVar18;
                    iVar18 = movmskpd(local_b8._0_4_,auVar29);
                    if (iVar18 != 0) {
                      local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_108,
                                 "Sample positions are not uniformly distributed within the pixel",
                                 "");
                      local_e0->m_code = QP_TEST_RESULT_FAIL;
                      (local_e0->m_description)._M_dataplus._M_p = (pointer)local_d8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_98._0_8_,local_108.m_format,
                                 CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0]) +
                                 (long)local_108.m_format);
LAB_004e0435:
                      if (local_108.m_format != (TextureFormat)(local_108.m_size.m_data + 2)) {
                        operator_delete((void *)local_108.m_format,local_108._16_8_ + 1);
                      }
                      bVar17 = false;
                    }
                  }
                }
              }
              pvVar5 = (void *)CONCAT44(local_b8._4_4_,local_b8._0_4_);
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,local_b8._16_8_ - (long)pvVar5);
              }
              if (!bVar17) {
                return local_e0;
              }
              uVar16 = uVar16 + 1;
              uVar9 = (local_d0->extent).width;
            } while (uVar16 < uVar9);
            uVar16 = (local_d0->extent).height;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar16);
        uVar9 = (local_d0->extent).depth;
        uVar10 = uVar16;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar9);
  }
  local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Passed","");
  local_e0->m_code = QP_TEST_RESULT_PASS;
  (local_e0->m_description)._M_dataplus._M_p = (pointer)&(local_e0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0->m_description,local_108.m_format,
             CONCAT44(local_108.m_size.m_data[1],local_108.m_size.m_data[0]) +
             (long)local_108.m_format);
LAB_004e059c:
  if (local_108.m_format != (TextureFormat)(local_108.m_size.m_data + 2)) {
    operator_delete((void *)local_108.m_format,local_108._16_8_ + 1);
  }
  return local_e0;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSamplePosDistribution>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	// approximate Bates distribution as normal
	const float variance = (1.0f / (12.0f * (float)numSamples));
	const float standardDeviation = deFloatSqrt(variance);

	// 95% of means of sample positions are within 2 standard deviations if
	// they were randomly assigned. Sample patterns are expected to be more
	// uniform than a random pattern.
	const float distanceThreshold = 2.0f * standardDeviation;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z).z();

		if (errorComponent > 0)
			return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			const tcu::Vec2 averageSamplePos	= tcu::Vec2((float)dataRS.getPixelUint(x, y, z).x() / 255.0f, (float)dataRS.getPixelUint(x, y, z).y() / 255.0f);
			const tcu::Vec2	distanceFromCenter	= tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		std::vector<tcu::Vec2> samplePositions(numSamples);

		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 errorComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z).z();

			if (errorComponent > 0)
				return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

			samplePositions[sampleNdx] = tcu::Vec2( (float)dataPerSample[sampleNdx].getPixelUint(x, y, z).x() / 255.0f,
													(float)dataPerSample[sampleNdx].getPixelUint(x, y, z).y() / 255.0f);
		}

		for (deUint32 sampleNdxA = 0u;				sampleNdxA < numSamples; ++sampleNdxA)
		for (deUint32 sampleNdxB = sampleNdxA + 1u; sampleNdxB < numSamples; ++sampleNdxB)
		{
			if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				return tcu::TestStatus::fail("Two samples have the same position");
		}

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			tcu::Vec2 averageSamplePos(0.0f, 0.0f);

			for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
			{
				averageSamplePos.x() += samplePositions[sampleNdx].x();
				averageSamplePos.y() += samplePositions[sampleNdx].y();
			}

			averageSamplePos.x() /= (float)numSamples;
			averageSamplePos.y() /= (float)numSamples;

			const tcu::Vec2	distanceFromCenter = tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	return tcu::TestStatus::pass("Passed");
}